

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O3

FUNCTION_RETURN getDiskInfos(DiskInfo *diskInfos,size_t *disk_info_size)

{
  char *pcVar1;
  ushort *puVar2;
  int iVar3;
  int iVar4;
  DiskInfo *pDVar5;
  void *pvVar6;
  undefined8 *puVar7;
  ulong uVar8;
  DIR *pDVar9;
  dirent *pdVar10;
  size_t __size;
  DiskInfo *pDVar11;
  size_t __n;
  ushort **ppuVar12;
  int *piVar13;
  __ino_t _Var14;
  ulong uVar15;
  ulong *puVar16;
  long lVar17;
  ulong uVar18;
  FUNCTION_RETURN FVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar21;
  uchar cur_character;
  stat sym_stat;
  stat mount_stat;
  char cur_dir [4096];
  byte local_11a9;
  void *local_11a8;
  DiskInfo *local_11a0;
  DiskInfo *local_1198;
  ulong *local_1190;
  ulong local_1188;
  DIR *local_1180;
  dirent *local_1178;
  __ino_t local_1170;
  char *local_1168;
  ulong *local_1160;
  stat local_1158;
  stat local_10c8;
  char local_1038 [4104];
  
  if (diskInfos == (DiskInfo *)0x0) {
    pDVar5 = (DiskInfo *)malloc(0x28f0);
    lVar17 = 0x14;
  }
  else {
    lVar17 = (long)(int)*disk_info_size;
    pDVar5 = diskInfos;
  }
  memset(pDVar5,0,lVar17 * 0x20c);
  pvVar6 = calloc(1,lVar17 << 3);
  lVar17 = setmntent("/proc/mounts","r");
  if (lVar17 == 0) {
    free(pDVar5);
LAB_002a0172:
    free(pvVar6);
    FVar19 = FUNC_RET_ERROR;
  }
  else {
    local_11a8 = pvVar6;
    local_11a0 = pDVar5;
    local_1198 = diskInfos;
    local_1190 = disk_info_size;
    puVar7 = (undefined8 *)getmntent(lVar17);
    uVar18 = 0;
    if (puVar7 != (undefined8 *)0x0) {
      uVar18 = 0;
      do {
        pcVar1 = (char *)puVar7[2];
        iVar4 = (int)uVar18;
        if (*pcVar1 == 'x') {
          if ((pcVar1[1] != 'f') || (pcVar1[2] != 's')) goto LAB_0029fd03;
LAB_0029fd2b:
          pcVar1 = (char *)*puVar7;
          if (((pcVar1 != (char *)0x0) && (iVar3 = strncmp(pcVar1,"/dev/",5), iVar3 == 0)) &&
             (iVar3 = stat(pcVar1,&local_10c8), iVar3 == 0)) {
            if (iVar4 < 1) {
LAB_0029fdb4:
              strncpy(local_11a0[iVar4].device,(char *)*puVar7,0xfe);
              *(__ino_t *)((long)local_11a8 + (long)iVar4 * 8) = local_10c8.st_ino;
              uVar18 = (ulong)(iVar4 + 1);
              iVar3 = iVar4;
            }
            else {
              uVar8 = 0xffffffff;
              uVar15 = 0;
              do {
                if (*(__ino_t *)((long)local_11a8 + uVar15 * 8) == local_10c8.st_ino) {
                  uVar8 = uVar15 & 0xffffffff;
                }
                uVar15 = uVar15 + 1;
              } while (uVar18 != uVar15);
              iVar3 = (int)uVar8;
              if (iVar3 == -1) goto LAB_0029fdb4;
            }
            if ((*(char *)puVar7[1] == '/') && (((char *)puVar7[1])[1] == '\0')) {
              local_11a0[iVar3].label[4] = '\0';
              builtin_strncpy(local_11a0[iVar3].label,"root",4);
              local_11a0[iVar3].preferred = true;
            }
          }
        }
        else {
          if ((*pcVar1 == 'e') && ((pcVar1[1] == 'x' && (pcVar1[2] == 't')))) goto LAB_0029fd2b;
LAB_0029fd03:
          iVar3 = strncmp(pcVar1,"vfat",4);
          if ((iVar3 == 0) || (iVar3 = strncmp(pcVar1,"ntfs",4), iVar3 == 0)) goto LAB_0029fd2b;
        }
        puVar7 = (undefined8 *)getmntent(lVar17);
      } while (puVar7 != (undefined8 *)0x0);
    }
    endmntent(lVar17);
    puVar16 = local_1190;
    iVar4 = (int)uVar18;
    if (local_1198 == (DiskInfo *)0x0) {
      *local_1190 = (long)iVar4;
      free(local_11a0);
LAB_002a0193:
      FVar19 = FUNC_RET_OK;
    }
    else {
      FVar19 = FUNC_RET_BUFFER_TOO_SMALL;
      local_1188 = uVar18;
      if ((ulong)(long)iVar4 <= *local_1190) {
        pDVar9 = opendir("/dev/disk/by-uuid");
        if (pDVar9 == (DIR *)0x0) {
          piVar13 = __errno_location();
          uVar20 = extraout_XMM0_Da;
          uVar21 = extraout_XMM0_Db;
          if (*piVar13 != 0) {
            strerror(*piVar13);
            uVar20 = extraout_XMM0_Da_00;
            uVar21 = extraout_XMM0_Db_00;
          }
          _log((double)CONCAT44(uVar21,uVar20));
          pvVar6 = local_11a8;
          goto LAB_002a0172;
        }
        *puVar16 = (long)iVar4;
        pdVar10 = readdir(pDVar9);
        local_1190 = (ulong *)(local_1188 & 0xffffffff);
        if (pdVar10 != (dirent *)0x0) {
          uVar18 = local_1188;
          local_1180 = pDVar9;
          do {
            builtin_strncpy(local_1038,"/dev/disk/by-uuid/",0x13);
            local_1168 = pdVar10->d_name;
            local_1178 = pdVar10;
            strncat(local_1038,local_1168,200);
            iVar4 = stat(local_1038,&local_1158);
            if ((iVar4 == 0) && (0 < (int)uVar18)) {
              puVar16 = (ulong *)0x0;
              local_1170 = local_1158.st_ino;
              pvVar6 = local_11a8;
              _Var14 = local_1158.st_ino;
              do {
                pcVar1 = local_1168;
                if (_Var14 == *(__ino_t *)((long)pvVar6 + (long)puVar16 * 8)) {
                  local_1160 = puVar16;
                  __size = strlen(local_1168);
                  pDVar11 = (DiskInfo *)malloc(__size);
                  pDVar5 = local_11a0 + (long)puVar16;
                  pDVar5->disk_sn[0] = '\0';
                  pDVar5->disk_sn[1] = '\0';
                  pDVar5->disk_sn[2] = '\0';
                  pDVar5->disk_sn[3] = '\0';
                  pDVar5->disk_sn[4] = '\0';
                  pDVar5->disk_sn[5] = '\0';
                  pDVar5->disk_sn[6] = '\0';
                  pDVar5->disk_sn[7] = '\0';
                  __n = strlen(pcVar1);
                  local_1198 = pDVar11;
                  memset(pDVar11,0,__n);
                  pDVar5 = local_11a0;
                  if (__size != 0) {
                    ppuVar12 = __ctype_b_loc();
                    puVar2 = *ppuVar12;
                    uVar18 = 0;
                    lVar17 = 0x13;
                    do {
                      if ((*(byte *)((long)puVar2 + (long)local_1178->d_name[lVar17 + -0x13] * 2 + 1
                                    ) & 0x10) != 0) {
                        local_1198->device[uVar18 - 4] = local_1178->d_name[lVar17 + -0x13];
                        uVar18 = (ulong)((int)uVar18 + 1);
                      }
                      iVar4 = (int)lVar17;
                      lVar17 = lVar17 + 1;
                    } while (iVar4 - 0x12 < __size);
                    uVar8 = uVar18;
                    if ((uVar18 & 1) != 0) {
                      uVar8 = (ulong)((int)uVar18 + 1);
                      local_1198->device[uVar18 - 4] = '0';
                    }
                    local_1198->device[uVar8 - 4] = '\0';
                    if (1 < (uint)uVar8) {
                      uVar18 = 0;
                      pDVar11 = local_1198;
                      do {
                        __isoc99_sscanf(pDVar11,"%2hhx",&local_11a9);
                        pDVar5[(long)puVar16].disk_sn[(uint)uVar18 & 7] =
                             pDVar5[(long)puVar16].disk_sn[(uint)uVar18 & 7] ^ local_11a9;
                        uVar18 = uVar18 + 1;
                        pDVar11 = (DiskInfo *)((long)&pDVar11->id + 2);
                      } while ((uint)uVar8 >> 1 != uVar18);
                    }
                  }
                  free(local_1198);
                  pvVar6 = local_11a8;
                  _Var14 = local_1170;
                  puVar16 = local_1160;
                  uVar18 = local_1188;
                }
                puVar16 = (ulong *)((long)puVar16 + 1);
              } while (puVar16 != local_1190);
            }
            pDVar9 = local_1180;
            pdVar10 = readdir(local_1180);
          } while (pdVar10 != (dirent *)0x0);
        }
        closedir(pDVar9);
        pDVar9 = opendir("/dev/disk/by-label");
        FVar19 = FUNC_RET_OK;
        if (pDVar9 != (DIR *)0x0) {
          pdVar10 = readdir(pDVar9);
          if (pdVar10 != (dirent *)0x0) {
            local_11a0 = (DiskInfo *)local_11a0->label;
            do {
              builtin_strncpy(local_1038,"/dev/disk/by-label/",0x14);
              strcat(local_1038,pdVar10->d_name);
              iVar4 = stat(local_1038,&local_1158);
              if ((iVar4 == 0) && (0 < (int)local_1188)) {
                puVar16 = (ulong *)0x0;
                pvVar6 = local_11a8;
                pDVar5 = local_11a0;
                do {
                  if (local_1158.st_ino == *(__ino_t *)((long)pvVar6 + (long)puVar16 * 8)) {
                    strncpy((char *)pDVar5,pdVar10->d_name,0xfe);
                    printf("label %d %s %s\n",(ulong)puVar16 & 0xffffffff,pDVar5,
                           pDVar5[-1].disk_sn + 2);
                    pvVar6 = local_11a8;
                  }
                  puVar16 = (ulong *)((long)puVar16 + 1);
                  pDVar5 = pDVar5 + 1;
                } while (local_1190 != puVar16);
              }
              pdVar10 = readdir(pDVar9);
            } while (pdVar10 != (dirent *)0x0);
          }
          closedir(pDVar9);
          goto LAB_002a0193;
        }
      }
    }
    free(local_11a8);
  }
  return FVar19;
}

Assistant:

FUNCTION_RETURN getDiskInfos(DiskInfo * diskInfos, size_t * disk_info_size) {
	struct stat mount_stat, sym_stat;
	/*static char discard[1024];
	 char device[64], name[64], type[64];
	 */
	char cur_dir[MAX_PATH];
	struct mntent *ent;

	int maxDrives, currentDrive, i, drive_found;
	__ino64_t *statDrives = NULL;
	DiskInfo *tmpDrives = NULL;
	FILE *aFile = NULL;
	DIR *disk_by_uuid_dir = NULL, *disk_by_label = NULL;
	struct dirent *dir = NULL;
	FUNCTION_RETURN result;

	if (diskInfos != NULL) {
		maxDrives = *disk_info_size;
		tmpDrives = diskInfos;
	} else {
		maxDrives = MAX_UNITS;
		tmpDrives = (DiskInfo *) malloc(sizeof(DiskInfo) * maxDrives);
	}
	memset(tmpDrives, 0, sizeof(DiskInfo) * maxDrives);
	statDrives = (__ino64_t *) malloc(maxDrives * sizeof(__ino64_t ));
	memset(statDrives, 0, sizeof(__ino64_t ) * maxDrives);
	;

	aFile = setmntent("/proc/mounts", "r");
	if (aFile == NULL) {
		/*proc not mounted*/
		free(tmpDrives);
		free(statDrives);
		return FUNC_RET_ERROR;
	}

	currentDrive = 0;
	while (NULL != (ent = getmntent(aFile))) {
		if ((strncmp(ent->mnt_type, "ext", 3) == 0
				|| strncmp(ent->mnt_type, "xfs", 3) == 0
				|| strncmp(ent->mnt_type, "vfat", 4) == 0
				|| strncmp(ent->mnt_type, "ntfs", 4) == 0)
				&& ent->mnt_fsname != NULL
				&& strncmp(ent->mnt_fsname, "/dev/", 5) == 0) {
			if (stat(ent->mnt_fsname, &mount_stat) == 0) {
				drive_found = -1;
				for (i = 0; i < currentDrive; i++) {
					if (statDrives[i] == mount_stat.st_ino) {
						drive_found = i;
					}
				}
				if (drive_found == -1) {
					LOG_DEBUG("mntent: %s %s %d\n", ent->mnt_fsname, ent->mnt_dir,
							(unsigned long int)mount_stat.st_ino);
					strncpy(tmpDrives[currentDrive].device, ent->mnt_fsname, 255-1);
					statDrives[currentDrive] = mount_stat.st_ino;
					drive_found = currentDrive;
					currentDrive++;
				}
				if (strcmp(ent->mnt_dir, "/") == 0) {
					strcpy(tmpDrives[drive_found].label, "root");
					LOG_DEBUG("drive %s set to preferred\n", ent->mnt_fsname);
					tmpDrives[drive_found].preferred = true;
				}
			}
		}
	}
	endmntent(aFile);

	if (diskInfos == NULL) {
		*disk_info_size = currentDrive;
		free(tmpDrives);
		result = FUNC_RET_OK;
	} else if (*disk_info_size >= currentDrive) {
		disk_by_uuid_dir = opendir("/dev/disk/by-uuid");
		if (disk_by_uuid_dir == NULL) {
			LOG_WARN("Open /dev/disk/by-uuid fail");
			free(statDrives);
			return FUNC_RET_ERROR;
		}
		result = FUNC_RET_OK;
		*disk_info_size = currentDrive;
		while ((dir = readdir(disk_by_uuid_dir)) != NULL) {
			strcpy(cur_dir, "/dev/disk/by-uuid/");
			strncat(cur_dir, dir->d_name, 200);
			if (stat(cur_dir, &sym_stat) == 0) {
				for (i = 0; i < currentDrive; i++) {
					if (sym_stat.st_ino == statDrives[i]) {
						parseUUID(dir->d_name, tmpDrives[i].disk_sn,
								sizeof(tmpDrives[i].disk_sn));
#ifdef _DEBUG
						VALGRIND_CHECK_VALUE_IS_DEFINED(tmpDrives[i].device);

						LOG_DEBUG("uuid %d %s %02x%02x%02x%02x\n", i,
								tmpDrives[i].device,
								tmpDrives[i].disk_sn[0],
								tmpDrives[i].disk_sn[1],
								tmpDrives[i].disk_sn[2],
								tmpDrives[i].disk_sn[3]);
#endif
					}
				}
			}
		}
		closedir(disk_by_uuid_dir);

		disk_by_label = opendir("/dev/disk/by-label");
		if (disk_by_label != NULL) {
			while ((dir = readdir(disk_by_label)) != NULL) {
				strcpy(cur_dir, "/dev/disk/by-label/");
				strcat(cur_dir, dir->d_name);
				if (stat(cur_dir, &sym_stat) == 0) {
					for (i = 0; i < currentDrive; i++) {
						if (sym_stat.st_ino == statDrives[i]) {
							strncpy(tmpDrives[i].label, dir->d_name, 255-1);
							printf("label %d %s %s\n", i, tmpDrives[i].label,
									tmpDrives[i].device);
						}
					}
				}
			}
			closedir(disk_by_label);
		}
	} else {
		result = FUNC_RET_BUFFER_TOO_SMALL;
	}
	/*
	 FILE *mounts = fopen(_PATH_MOUNTED, "r");
	 if (mounts == NULL) {
	 return ERROR;
	 }

	 while (fscanf(mounts, "%64s %64s %64s %1024[^\n]", device, name, type,
	 discard) != EOF) {
	 if (stat(device, &mount_stat) != 0)
	 continue;
	 if (filename_stat.st_dev == mount_stat.st_rdev) {
	 fprintf(stderr, "device: %s; name: %s; type: %s\n", device, name,
	 type);
	 }
	 }
	 */
	free(statDrives);
	return result;
}